

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_tests.cpp
# Opt level: O3

void populate_arena(vector<const_char_*,_std::allocator<const_char_*>_> *devices)

{
  pointer ppcVar1;
  char *__s;
  size_t sVar2;
  pointer ppcVar3;
  ostringstream command;
  undefined1 auStack_1c8 [8];
  char *local_1c0;
  char local_1b0 [16];
  long local_1a0 [14];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/tests/fake-sys/populate_arena.py"
             ,0x6d);
  ppcVar3 = (devices->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar1 = (devices->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar3 != ppcVar1) {
    do {
      __s = *ppcVar3;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," ",1);
      if (__s == (char *)0x0) {
        std::ios::clear((int)auStack_1c8 + (int)*(undefined8 *)(local_1a0[0] + -0x18) + 0x28);
      }
      else {
        sVar2 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,__s,sVar2);
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 != ppcVar1);
  }
  system(
        "/workspace/llm4binary/github/license_c_cmakelists/ddemidov[P]ev3dev-lang-cpp/tests/fake-sys/clean_arena.py"
        );
  std::__cxx11::stringbuf::str();
  system(local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void populate_arena(const std::vector<const char*> &devices) {
    std::ostringstream command;
    command << FAKE_SYS "/populate_arena.py";
    for (auto d : devices) command << " " << d;

    system(FAKE_SYS "/clean_arena.py");
    system(command.str().c_str());
}